

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O2

void __thiscall SynthWidget::on_midiRecord_clicked(SynthWidget *this)

{
  QPushButton *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  undefined4 uVar6;
  int iVar7;
  Master *this_00;
  QSettings *pQVar8;
  QString fileName;
  QArrayDataPointer<char16_t> local_80;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  
  bVar5 = SynthRoute::isRecordingMidi(this->synthRoute);
  if (bVar5) {
    bVar5 = SynthRoute::stopRecordingMidi(this->synthRoute);
    pQVar1 = (this->ui->super_Ui_SynthWidget).midiRecord;
    QString::QString((QString *)&local_68,"Record");
    QAbstractButton::setText((QString *)pQVar1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    if (bVar5) {
      if (on_midiRecord_clicked()::currentDir == '\0') {
        iVar7 = __cxa_guard_acquire(&on_midiRecord_clicked()::currentDir);
        if (iVar7 != 0) {
          QString::QString(&on_midiRecord_clicked::currentDir,(char *)0x0);
          __cxa_atexit(QString::~QString,&on_midiRecord_clicked::currentDir,&__dso_handle);
          __cxa_guard_release(&on_midiRecord_clicked()::currentDir);
        }
      }
      this_00 = Master::getInstance();
      pQVar8 = Master::getSettings(this_00);
      QString::QString((QString *)&local_80,"Master/qFileDialogOptions");
      QVariant::QVariant((QVariant *)&local_48,0);
      QSettings::value((QString *)&local_68,(QVariant *)pQVar8);
      uVar6 = QVariant::toInt((bool *)&local_68);
      QVariant::~QVariant(&local_68);
      QVariant::~QVariant((QVariant *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      QString::QString((QString *)&local_48,(char *)0x0);
      QString::QString((QString *)&local_80,"Standard MIDI files (*.mid)");
      QFileDialog::getSaveFileName
                (&local_68,this,&local_48,&on_midiRecord_clicked::currentDir,&local_80,0,uVar6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
      if (local_68.d.data._16_8_ != 0) {
        QDir::QDir((QDir *)&local_80,(QString *)&local_68);
        QDir::absolutePath();
        qVar4 = on_midiRecord_clicked::currentDir.d.size;
        pcVar3 = on_midiRecord_clicked::currentDir.d.ptr;
        pDVar2 = on_midiRecord_clicked::currentDir.d.d;
        on_midiRecord_clicked::currentDir.d.d = (Data *)local_48.shared;
        on_midiRecord_clicked::currentDir.d.ptr = (char16_t *)local_48._8_8_;
        local_48.shared = (PrivateShared *)pDVar2;
        local_48._8_8_ = pcVar3;
        on_midiRecord_clicked::currentDir.d.size = local_48._16_8_;
        local_48._16_8_ = qVar4;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
        QDir::~QDir((QDir *)&local_80);
      }
      SynthRoute::saveRecordedMidi(this->synthRoute,(QString *)&local_68,1000000);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    }
  }
  else {
    pQVar1 = (this->ui->super_Ui_SynthWidget).midiRecord;
    QString::QString((QString *)&local_68,"Stop");
    QAbstractButton::setText((QString *)pQVar1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    SynthRoute::startRecordingMidi(this->synthRoute);
  }
  return;
}

Assistant:

void SynthWidget::on_midiRecord_clicked() {
	if (synthRoute->isRecordingMidi()) {
		bool isMidiDataRecorded = synthRoute->stopRecordingMidi();
		ui->midiRecord->setText("Record");
		if (isMidiDataRecorded) {
			static QString currentDir = NULL;
			QFileDialog::Options qFileDialogOptions = QFileDialog::Options(Master::getInstance()->getSettings()->value("Master/qFileDialogOptions", 0).toInt());
			QString fileName = QFileDialog::getSaveFileName(this, NULL, currentDir, "Standard MIDI files (*.mid)",
				NULL, qFileDialogOptions);
			if (!fileName.isEmpty()) currentDir = QDir(fileName).absolutePath();
			synthRoute->saveRecordedMidi(fileName, MasterClock::NANOS_PER_MILLISECOND);
		}
	} else {
		ui->midiRecord->setText("Stop");
		synthRoute->startRecordingMidi();
	}
}